

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cpp
# Opt level: O3

BrotliDecoderErrorCode
duckdb_brotli::DecodeContextMap
          (uint64_t context_map_size,uint64_t *num_htrees,uint8_t **context_map_arg,
          BrotliDecoderStateInternal *s)

{
  BrotliDecoderErrorCode BVar1;
  int iVar2;
  uint8_t *puVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint64_t uVar8;
  ulong uVar9;
  ulong uVar10;
  size_t __n;
  byte *pbVar11;
  HuffmanCode *pHVar12;
  uint64_t uVar13;
  BrotliBitReader *br;
  BrotliRunningContextMapState BVar14;
  bool bVar15;
  uint64_t code;
  uint64_t local_48;
  HuffmanCode *local_40;
  BrotliBitReader *local_38;
  
  BVar14 = (s->arena).header.substate_context_map;
  if (BROTLI_STATE_CONTEXT_MAP_TRANSFORM < BVar14) {
    return BROTLI_DECODER_ERROR_UNREACHABLE;
  }
  br = &s->br;
  switch(BVar14) {
  case BROTLI_STATE_CONTEXT_MAP_NONE:
    BVar1 = DecodeVarLenUint8(s,br,num_htrees);
    if (BVar1 != BROTLI_DECODER_SUCCESS) {
      return BVar1;
    }
    *num_htrees = *num_htrees + 1;
    (s->arena).header.context_index = 0;
    puVar3 = (uint8_t *)(*s->alloc_func)(s->memory_manager_opaque,context_map_size);
    *context_map_arg = puVar3;
    if (puVar3 == (uint8_t *)0x0) {
      return BROTLI_DECODER_ERROR_ALLOC_CONTEXT_MAP;
    }
    if (*num_htrees < 2) {
      memset(puVar3,0,context_map_size);
      return BROTLI_DECODER_SUCCESS;
    }
    (s->arena).header.substate_context_map = BROTLI_STATE_CONTEXT_MAP_READ_PREFIX;
  case BROTLI_STATE_CONTEXT_MAP_READ_PREFIX:
    uVar6 = (s->br).bit_pos_;
    if (uVar6 < 5) {
      pbVar11 = (s->br).next_in;
      if (pbVar11 == (s->br).last_in) {
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      uVar4 = (ulong)*pbVar11 << ((byte)uVar6 & 0x3f) | (s->br).val_;
      uVar6 = uVar6 | 8;
      (s->br).next_in = pbVar11 + 1;
    }
    else {
      uVar4 = br->val_;
    }
    uVar8 = (uint64_t)(-((uint)uVar4 & 1) & ((uint)(uVar4 >> 1) & 0xf) + 1);
    (s->arena).header.max_run_length_prefix = uVar8;
    (s->br).bit_pos_ = (-(ulong)((uVar4 & 1) == 0) | 0xfffffffffffffffb) + uVar6;
    (s->br).val_ = uVar4 >> ((byte)uVar4 & 1) * '\x04' + 1;
    (s->arena).header.substate_context_map = BROTLI_STATE_CONTEXT_MAP_HUFFMAN;
    break;
  case BROTLI_STATE_CONTEXT_MAP_HUFFMAN:
    uVar8 = (s->arena).header.max_run_length_prefix;
    break;
  case BROTLI_STATE_CONTEXT_MAP_DECODE:
    uVar8 = (s->arena).header.code;
    goto LAB_0032b4ac;
  case BROTLI_STATE_CONTEXT_MAP_TRANSFORM:
    goto switchD_0032b363_caseD_4;
  }
  BVar1 = ReadHuffmanCode(uVar8 + *num_htrees,uVar8 + *num_htrees,
                          (s->arena).header.context_map_table,(uint64_t *)0x0,s);
  if (BVar1 != BROTLI_DECODER_SUCCESS) {
    return BVar1;
  }
  (s->arena).header.code = 0xffff;
  (s->arena).header.substate_context_map = BROTLI_STATE_CONTEXT_MAP_DECODE;
  uVar8 = 0xffff;
LAB_0032b4ac:
  uVar6 = (s->arena).header.context_index;
  uVar4 = (s->arena).header.max_run_length_prefix;
  puVar3 = *context_map_arg;
  bVar15 = uVar8 != 0xffff;
  local_48 = uVar8;
  if (uVar6 < context_map_size || bVar15) {
    local_40 = (s->arena).header.context_map_table;
    local_38 = br;
    do {
      uVar5 = (s->br).bit_pos_;
      if (bVar15) {
LAB_0032b5fd:
        if (uVar5 < uVar8) {
          pbVar11 = (s->br).next_in;
          do {
            if (pbVar11 == (s->br).last_in) {
LAB_0032b720:
              (s->arena).header.code = uVar8;
              (s->arena).header.context_index = uVar6;
              return BROTLI_DECODER_NEEDS_MORE_INPUT;
            }
            uVar13 = (ulong)*pbVar11 << ((byte)uVar5 & 0x3f) | (s->br).val_;
            (s->br).val_ = uVar13;
            uVar5 = uVar5 + 8;
            (s->br).bit_pos_ = uVar5;
            pbVar11 = pbVar11 + 1;
            (s->br).next_in = pbVar11;
          } while (uVar5 < uVar8);
        }
        else {
          uVar13 = br->val_;
        }
        uVar9 = *(ulong *)(kBrotliBitMask + uVar8 * 8);
        (s->br).bit_pos_ = uVar5 - uVar8;
        (s->br).val_ = uVar13 >> ((byte)uVar8 & 0x3f);
        __n = (ulong)(uint)(1 << ((byte)uVar8 & 0x1f)) + (uVar9 & uVar13);
        uVar5 = __n + uVar6;
        if (context_map_size < uVar5) {
          return BROTLI_DECODER_ERROR_FORMAT_CONTEXT_MAP_REPEAT;
        }
        memset(puVar3 + uVar6,0,__n);
        br = local_38;
      }
      else {
        if (uVar5 < 0xf) {
          pbVar11 = (s->br).next_in;
          uVar10 = uVar5;
          do {
            if (pbVar11 == (s->br).last_in) {
              iVar2 = SafeDecodeSymbol(local_40,br,&local_48);
              br = local_38;
              if (iVar2 != 0) goto LAB_0032b5cf;
              uVar8 = 0xffff;
              goto LAB_0032b720;
            }
            uVar9 = (ulong)*pbVar11 << ((byte)uVar10 & 0x3f) | (s->br).val_;
            (s->br).val_ = uVar9;
            uVar5 = uVar10 + 8;
            (s->br).bit_pos_ = uVar5;
            pbVar11 = pbVar11 + 1;
            (s->br).next_in = pbVar11;
            bVar15 = uVar10 < 7;
            uVar10 = uVar5;
          } while (bVar15);
        }
        else {
          uVar9 = br->val_;
        }
        pHVar12 = local_40 + (uVar9 & 0xff);
        uVar7 = (ulong)pHVar12->bits;
        uVar10 = uVar9;
        if (8 < uVar7) {
          uVar5 = uVar5 - 8;
          uVar10 = uVar9 >> 8;
          pHVar12 = pHVar12 + (ulong)(*(uint *)(kBrotliBitMask + (ulong)(pHVar12->bits - 8) * 8) &
                                      (uint)(uVar9 >> 8) & 0x7f) + (ulong)pHVar12->value;
          uVar7 = (ulong)pHVar12->bits;
        }
        (s->br).bit_pos_ = uVar5 - uVar7;
        (s->br).val_ = uVar10 >> ((byte)uVar7 & 0x3f);
        local_48 = (uint64_t)pHVar12->value;
LAB_0032b5cf:
        if (local_48 == 0) {
          puVar3[uVar6] = '\0';
          uVar8 = 0;
        }
        else {
          uVar8 = local_48;
          if (local_48 <= uVar4) {
            uVar5 = (s->br).bit_pos_;
            goto LAB_0032b5fd;
          }
          puVar3[uVar6] = (char)local_48 - (char)uVar4;
        }
        uVar5 = uVar6 + 1;
      }
      bVar15 = false;
      uVar6 = uVar5;
    } while (uVar5 < context_map_size);
  }
switchD_0032b363_caseD_4:
  uVar8 = (s->br).bit_pos_;
  if (uVar8 == 0) {
    pbVar11 = (s->br).next_in;
    if (pbVar11 == (s->br).last_in) {
      BVar1 = BROTLI_DECODER_NEEDS_MORE_INPUT;
      BVar14 = BROTLI_STATE_CONTEXT_MAP_TRANSFORM;
      goto LAB_0032b70b;
    }
    uVar6 = (ulong)*pbVar11 | (s->br).val_;
    (s->br).next_in = pbVar11 + 1;
    uVar8 = 7;
  }
  else {
    uVar6 = br->val_;
    uVar8 = uVar8 - 1;
  }
  (s->br).bit_pos_ = uVar8;
  (s->br).val_ = uVar6 >> 1;
  BVar1 = BROTLI_DECODER_SUCCESS;
  BVar14 = BROTLI_STATE_CONTEXT_MAP_NONE;
  if ((uVar6 & 1) != 0) {
    InverseMoveToFrontTransform(*context_map_arg,context_map_size,s);
  }
LAB_0032b70b:
  (s->arena).header.substate_context_map = BVar14;
  return BVar1;
}

Assistant:

static BrotliDecoderErrorCode DecodeContextMap(brotli_reg_t context_map_size, brotli_reg_t *num_htrees,
                                               uint8_t **context_map_arg, BrotliDecoderState *s) {
	BrotliBitReader *br = &s->br;
	BrotliDecoderErrorCode result = BROTLI_DECODER_SUCCESS;
	BrotliMetablockHeaderArena *h = &s->arena.header;

	switch ((int)h->substate_context_map) {
	case BROTLI_STATE_CONTEXT_MAP_NONE:
		result = DecodeVarLenUint8(s, br, num_htrees);
		if (result != BROTLI_DECODER_SUCCESS) {
			return result;
		}
		(*num_htrees)++;
		h->context_index = 0;
		BROTLI_LOG_UINT(context_map_size);
		BROTLI_LOG_UINT(*num_htrees);
		*context_map_arg = (uint8_t *)BROTLI_DECODER_ALLOC(s, (size_t)context_map_size);
		if (*context_map_arg == 0) {
			return BROTLI_FAILURE(BROTLI_DECODER_ERROR_ALLOC_CONTEXT_MAP);
		}
		if (*num_htrees <= 1) {
			memset(*context_map_arg, 0, (size_t)context_map_size);
			return BROTLI_DECODER_SUCCESS;
		}
		h->substate_context_map = BROTLI_STATE_CONTEXT_MAP_READ_PREFIX;
		/* Fall through. */

	case BROTLI_STATE_CONTEXT_MAP_READ_PREFIX: {
		brotli_reg_t bits;
		/* In next stage ReadHuffmanCode uses at least 4 bits, so it is safe
		   to peek 4 bits ahead. */
		if (!BrotliSafeGetBits(br, 5, &bits)) {
			return BROTLI_DECODER_NEEDS_MORE_INPUT;
		}
		if ((bits & 1) != 0) { /* Use RLE for zeros. */
			h->max_run_length_prefix = (bits >> 1) + 1;
			BrotliDropBits(br, 5);
		} else {
			h->max_run_length_prefix = 0;
			BrotliDropBits(br, 1);
		}
		BROTLI_LOG_UINT(h->max_run_length_prefix);
		h->substate_context_map = BROTLI_STATE_CONTEXT_MAP_HUFFMAN;
	}
		/* Fall through. */

	case BROTLI_STATE_CONTEXT_MAP_HUFFMAN: {
		brotli_reg_t alphabet_size = *num_htrees + h->max_run_length_prefix;
		result = ReadHuffmanCode(alphabet_size, alphabet_size, h->context_map_table, NULL, s);
		if (result != BROTLI_DECODER_SUCCESS)
			return result;
		h->code = 0xFFFF;
		h->substate_context_map = BROTLI_STATE_CONTEXT_MAP_DECODE;
	}
		/* Fall through. */

	case BROTLI_STATE_CONTEXT_MAP_DECODE: {
		brotli_reg_t context_index = h->context_index;
		brotli_reg_t max_run_length_prefix = h->max_run_length_prefix;
		uint8_t *context_map = *context_map_arg;
		brotli_reg_t code = h->code;
		BROTLI_BOOL skip_preamble = (code != 0xFFFF);
		while (context_index < context_map_size || skip_preamble) {
			if (!skip_preamble) {
				if (!SafeReadSymbol(h->context_map_table, br, &code)) {
					h->code = 0xFFFF;
					h->context_index = context_index;
					return BROTLI_DECODER_NEEDS_MORE_INPUT;
				}
				BROTLI_LOG_UINT(code);

				if (code == 0) {
					context_map[context_index++] = 0;
					continue;
				}
				if (code > max_run_length_prefix) {
					context_map[context_index++] = (uint8_t)(code - max_run_length_prefix);
					continue;
				}
			} else {
				skip_preamble = BROTLI_FALSE;
			}
			/* RLE sub-stage. */
			{
				brotli_reg_t reps;
				if (!BrotliSafeReadBits(br, code, &reps)) {
					h->code = code;
					h->context_index = context_index;
					return BROTLI_DECODER_NEEDS_MORE_INPUT;
				}
				reps += 1U << code;
				BROTLI_LOG_UINT(reps);
				if (context_index + reps > context_map_size) {
					return BROTLI_FAILURE(BROTLI_DECODER_ERROR_FORMAT_CONTEXT_MAP_REPEAT);
				}
				do {
					context_map[context_index++] = 0;
				} while (--reps);
			}
		}
	}
		/* Fall through. */

	case BROTLI_STATE_CONTEXT_MAP_TRANSFORM: {
		brotli_reg_t bits;
		if (!BrotliSafeReadBits(br, 1, &bits)) {
			h->substate_context_map = BROTLI_STATE_CONTEXT_MAP_TRANSFORM;
			return BROTLI_DECODER_NEEDS_MORE_INPUT;
		}
		if (bits != 0) {
			InverseMoveToFrontTransform(*context_map_arg, context_map_size, s);
		}
		h->substate_context_map = BROTLI_STATE_CONTEXT_MAP_NONE;
		return BROTLI_DECODER_SUCCESS;
	}

	default:
		return BROTLI_FAILURE(BROTLI_DECODER_ERROR_UNREACHABLE); /* COV_NF_LINE */
	}
}